

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O1

void secp256k1_modinv64_update_de_62
               (secp256k1_modinv64_signed62 *d,secp256k1_modinv64_signed62 *e,
               secp256k1_modinv64_trans2x2 *t,secp256k1_modinv64_modinfo *modinfo)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  uint uVar4;
  secp256k1_modinv64_signed62 *psVar5;
  int64_t iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  secp256k1_modinv64_signed62 *factor;
  long lVar10;
  long lVar11;
  long lVar12;
  secp256k1_modinv64_signed62 *a;
  secp256k1_modinv64_signed62 *psVar13;
  int iVar14;
  int alen;
  secp256k1_modinv64_signed62 *psVar15;
  long lVar16;
  secp256k1_modinv64_signed62 *psVar17;
  secp256k1_modinv64_signed62 *psVar18;
  int64_t *piVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  int64_t *piVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  secp256k1_modinv64_signed62 *psVar28;
  ulong uVar29;
  bool bVar30;
  secp256k1_modinv64_signed62 sStack_120;
  secp256k1_modinv64_signed62 sStack_f8;
  secp256k1_modinv64_signed62 *psStack_d0;
  secp256k1_modinv64_signed62 *psStack_c8;
  secp256k1_modinv64_signed62 *psStack_c0;
  ulong local_b0;
  secp256k1_modinv64_signed62 *local_a8;
  ulong local_a0;
  secp256k1_modinv64_signed62 *local_98;
  secp256k1_modinv64_signed62 *local_90;
  secp256k1_modinv64_signed62 *local_88;
  secp256k1_modinv64_signed62 *local_80;
  int64_t local_78;
  secp256k1_modinv64_signed62 *local_70;
  secp256k1_modinv64_signed62 *local_68;
  secp256k1_modinv64_signed62 *local_60;
  secp256k1_modinv64_signed62 *local_58;
  int64_t local_50;
  secp256k1_modinv64_signed62 *local_48;
  int64_t local_40;
  int64_t local_38;
  
  lVar16 = d->v[0];
  local_38 = d->v[1];
  local_48 = (secp256k1_modinv64_signed62 *)d->v[2];
  local_50 = d->v[3];
  psVar28 = (secp256k1_modinv64_signed62 *)d->v[4];
  local_90 = (secp256k1_modinv64_signed62 *)e->v[0];
  psVar17 = (secp256k1_modinv64_signed62 *)e->v[1];
  local_40 = e->v[2];
  psVar5 = (secp256k1_modinv64_signed62 *)e->v[3];
  local_a0 = t->u;
  local_98 = (secp256k1_modinv64_signed62 *)t->v;
  local_b0 = t->q;
  local_a8 = (secp256k1_modinv64_signed62 *)t->r;
  local_78 = e->v[4];
  psVar15 = (secp256k1_modinv64_signed62 *)0x5;
  factor = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
  psStack_c0 = (secp256k1_modinv64_signed62 *)0x117aaa;
  psVar18 = d;
  iVar3 = secp256k1_modinv64_mul_cmp_62(d,5,&secp256k1_const_modinfo_fe.modulus,-2);
  if (iVar3 < 1) {
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x1183df;
    secp256k1_modinv64_update_de_62_cold_28();
LAB_001183df:
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x1183e4;
    secp256k1_modinv64_update_de_62_cold_27();
LAB_001183e4:
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x1183e9;
    secp256k1_modinv64_update_de_62_cold_26();
LAB_001183e9:
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x1183ee;
    secp256k1_modinv64_update_de_62_cold_25();
LAB_001183ee:
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x1183f3;
    secp256k1_modinv64_update_de_62_cold_24();
LAB_001183f3:
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x1183f8;
    secp256k1_modinv64_update_de_62_cold_23();
LAB_001183f8:
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x1183fd;
    secp256k1_modinv64_update_de_62_cold_1();
LAB_001183fd:
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x118402;
    secp256k1_modinv64_update_de_62_cold_2();
    psVar13 = psVar17;
LAB_00118402:
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x118407;
    secp256k1_modinv64_update_de_62_cold_3();
LAB_00118407:
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x11840c;
    secp256k1_modinv64_update_de_62_cold_4();
LAB_0011840c:
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x118411;
    secp256k1_modinv64_update_de_62_cold_5();
LAB_00118411:
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x118416;
    secp256k1_modinv64_update_de_62_cold_6();
LAB_00118416:
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x11841b;
    secp256k1_modinv64_update_de_62_cold_7();
    psVar17 = psVar15;
LAB_0011841b:
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x118420;
    secp256k1_modinv64_update_de_62_cold_8();
LAB_00118420:
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x118425;
    secp256k1_modinv64_update_de_62_cold_9();
LAB_00118425:
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x11842a;
    secp256k1_modinv64_update_de_62_cold_10();
LAB_0011842a:
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x11842f;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_0011842f:
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x118434;
    secp256k1_modinv64_update_de_62_cold_12();
LAB_00118434:
    iVar3 = (int)psVar17;
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x118439;
    secp256k1_modinv64_update_de_62_cold_13();
LAB_00118439:
    iVar14 = iVar3;
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x11843e;
    secp256k1_modinv64_update_de_62_cold_14();
LAB_0011843e:
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x118443;
    secp256k1_modinv64_update_de_62_cold_15();
LAB_00118443:
    alen = iVar14;
    d = psVar13;
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x118448;
    secp256k1_modinv64_update_de_62_cold_16();
LAB_00118448:
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x11844d;
    secp256k1_modinv64_update_de_62_cold_22();
LAB_0011844d:
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x118452;
    secp256k1_modinv64_update_de_62_cold_21();
LAB_00118452:
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x118457;
    secp256k1_modinv64_update_de_62_cold_20();
LAB_00118457:
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x11845c;
    secp256k1_modinv64_update_de_62_cold_19();
LAB_0011845c:
    e = psVar18;
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x118461;
    secp256k1_modinv64_update_de_62_cold_18();
  }
  else {
    factor = (secp256k1_modinv64_signed62 *)0x1;
    psVar15 = (secp256k1_modinv64_signed62 *)0x5;
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x117acb;
    psVar18 = d;
    iVar3 = secp256k1_modinv64_mul_cmp_62(d,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar3) goto LAB_001183df;
    psVar15 = (secp256k1_modinv64_signed62 *)0x5;
    factor = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x117aee;
    psVar18 = e;
    iVar3 = secp256k1_modinv64_mul_cmp_62(e,5,&secp256k1_const_modinfo_fe.modulus,-2);
    if (iVar3 < 1) goto LAB_001183e4;
    factor = (secp256k1_modinv64_signed62 *)0x1;
    psVar15 = (secp256k1_modinv64_signed62 *)0x5;
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x117b0f;
    psVar18 = e;
    iVar3 = secp256k1_modinv64_mul_cmp_62(e,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar3) goto LAB_001183e9;
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x117b35;
    local_80 = psVar28;
    local_60 = psVar5;
    psVar5 = (secp256k1_modinv64_signed62 *)secp256k1_modinv64_abs(local_a0);
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x117b42;
    psVar18 = local_98;
    iVar6 = secp256k1_modinv64_abs((int64_t)local_98);
    factor = (secp256k1_modinv64_signed62 *)(0x4000000000000000 - iVar6);
    psVar28 = (secp256k1_modinv64_signed62 *)0x3fffffffffffffff;
    if ((long)factor < (long)psVar5) goto LAB_001183ee;
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x117b5e;
    psVar5 = (secp256k1_modinv64_signed62 *)secp256k1_modinv64_abs(local_b0);
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x117b6b;
    psVar18 = local_a8;
    iVar6 = secp256k1_modinv64_abs((int64_t)local_a8);
    factor = (secp256k1_modinv64_signed62 *)(0x4000000000000000 - iVar6);
    if ((long)factor < (long)psVar5) goto LAB_001183f3;
    psVar28 = (secp256k1_modinv64_signed62 *)0x7fffffffffffffff;
    psVar15 = (secp256k1_modinv64_signed62 *)(local_a0 * lVar16);
    factor = SUB168(SEXT816((long)local_a0) * SEXT816(lVar16),8);
    uVar7 = (long)local_98 * (long)local_90;
    lVar11 = SUB168(SEXT816((long)local_98) * SEXT816((long)local_90),8);
    lVar10 = (0x7fffffffffffffff - lVar11) - (long)factor;
    psVar18 = local_90;
    local_58 = psVar17;
    if (-1 < lVar11 &&
        (SBORROW8(0x7fffffffffffffff - lVar11,(long)factor) !=
        SBORROW8(lVar10,(ulong)((secp256k1_modinv64_signed62 *)~uVar7 < psVar15))) !=
        (long)(lVar10 - (ulong)((secp256k1_modinv64_signed62 *)~uVar7 < psVar15)) < 0)
    goto LAB_001183f8;
    piVar23 = (int64_t *)((long)psVar15->v + uVar7);
    lVar24 = (long)factor->v + (ulong)CARRY8(uVar7,(ulong)psVar15) + lVar11;
    psVar5 = (secp256k1_modinv64_signed62 *)(local_b0 * lVar16);
    lVar11 = SUB168(SEXT816((long)local_b0) * SEXT816(lVar16),8);
    uVar8 = (long)local_a8 * (long)local_90;
    lVar12 = SUB168(SEXT816((long)local_a8) * SEXT816((long)local_90),8);
    uVar7 = (ulong)((secp256k1_modinv64_signed62 *)(-uVar8 - 1) < psVar5);
    lVar16 = (0x7fffffffffffffff - lVar12) - lVar11;
    lVar10 = lVar16 - uVar7;
    bVar30 = (SBORROW8(0x7fffffffffffffff - lVar12,lVar11) != SBORROW8(lVar16,uVar7)) == lVar10 < 0;
    factor = (secp256k1_modinv64_signed62 *)
             CONCAT71((int7)((ulong)lVar10 >> 8),lVar12 < 0 || bVar30);
    if (lVar12 >= 0 && !bVar30) goto LAB_001183fd;
    factor = (secp256k1_modinv64_signed62 *)(local_78 >> 0x3f);
    lVar16 = ((ulong)local_98 & (ulong)factor) + (local_a0 & (long)local_80 >> 0x3f);
    piVar19 = (int64_t *)((long)psVar5->v + uVar8);
    psVar18 = (secp256k1_modinv64_signed62 *)(lVar12 + lVar11 + (ulong)CARRY8(uVar8,(ulong)psVar5));
    local_68 = (secp256k1_modinv64_signed62 *)
               (lVar16 - ((long)piVar23 * 0x27c7f6e22ddacacf + lVar16 & 0x3fffffffffffffffU));
    psVar5 = (secp256k1_modinv64_signed62 *)((long)local_68 * -0x1000003d1);
    lVar10 = SUB168(SEXT816((long)local_68) * SEXT816(-0x1000003d1),8);
    uVar7 = (ulong)((undefined1 *)((long)local_68 * 0x1000003d1 - 1U) < piVar23);
    lVar16 = (0x7fffffffffffffff - lVar10) - lVar24;
    psVar13 = (secp256k1_modinv64_signed62 *)
              ((-0x8000000000000000 - lVar10) -
              (ulong)(psVar5 != (secp256k1_modinv64_signed62 *)0x0));
    uVar8 = (ulong)(piVar23 < (undefined1 *)((long)local_68 * 0x1000003d1));
    bVar30 = (SBORROW8(lVar24,(long)psVar13) != SBORROW8(lVar24 - (long)psVar13,uVar8)) ==
             (long)((lVar24 - (long)psVar13) - uVar8) < 0;
    if ((long)local_68 < 1) {
      bVar30 = (SBORROW8(0x7fffffffffffffff - lVar10,lVar24) != SBORROW8(lVar16,uVar7)) ==
               (long)(lVar16 - uVar7) < 0;
    }
    psVar15 = local_68;
    local_90 = d;
    local_88 = e;
    if (!bVar30) goto LAB_00118402;
    lVar16 = ((ulong)factor & (ulong)local_a8) + ((long)local_80 >> 0x3f & local_b0);
    factor = (secp256k1_modinv64_signed62 *)
             (lVar16 - ((long)piVar19 * 0x27c7f6e22ddacacf + lVar16 & 0x3fffffffffffffffU));
    bVar30 = CARRY8((ulong)psVar5,(ulong)piVar23);
    psVar5 = (secp256k1_modinv64_signed62 *)((long)piVar23 + (long)psVar5->v);
    lVar24 = lVar10 + lVar24 + (ulong)bVar30;
    psVar15 = (secp256k1_modinv64_signed62 *)((long)factor >> 0x3f);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = factor;
    uVar8 = SUB168(auVar1 * ZEXT816(0xfffffffefffffc2f),0);
    psVar13 = (secp256k1_modinv64_signed62 *)-(long)factor;
    lVar11 = (long)psVar13 +
             (long)psVar15 * -0x1000003d1 + SUB168(auVar1 * ZEXT816(0xfffffffefffffc2f),8);
    uVar7 = (ulong)((undefined1 *)(-uVar8 - 1) < piVar19);
    lVar16 = (0x7fffffffffffffff - lVar11) - (long)psVar18;
    lVar12 = (-0x8000000000000000 - lVar11) - (ulong)(uVar8 != 0);
    lVar10 = (long)psVar18 - lVar12;
    bVar30 = (SBORROW8((long)psVar18,lVar12) !=
             SBORROW8(lVar10,(ulong)(piVar19 < (undefined1 *)-uVar8))) ==
             (long)(lVar10 - (ulong)(piVar19 < (undefined1 *)-uVar8)) < 0;
    if ((long)factor < 1) {
      bVar30 = (SBORROW8(0x7fffffffffffffff - lVar11,(long)psVar18) != SBORROW8(lVar16,uVar7)) ==
               (long)(lVar16 - uVar7) < 0;
    }
    local_70 = psVar15;
    if (!bVar30) goto LAB_00118407;
    lVar16 = (long)psVar18 + (ulong)CARRY8(uVar8,(ulong)piVar19) + lVar11;
    if (((ulong)psVar5 & 0x3fffffffffffffff) != 0) goto LAB_0011840c;
    if (((long)piVar19 + uVar8 & 0x3fffffffffffffff) != 0) goto LAB_00118411;
    uVar7 = (ulong)psVar5 >> 0x3e | lVar24 * 4;
    uVar21 = local_a0 * local_38 + uVar7;
    psVar18 = (secp256k1_modinv64_signed62 *)
              (SUB168(SEXT816((long)local_a0) * SEXT816(local_38),8) + (lVar24 >> 0x3e) +
              (ulong)CARRY8(local_a0 * local_38,uVar7));
    psVar5 = (secp256k1_modinv64_signed62 *)((long)local_98 * (long)psVar17);
    lVar12 = SUB168(SEXT816((long)local_98) * SEXT816((long)psVar17),8);
    uVar7 = (ulong)(-(long)psVar5 - 1U < uVar21);
    lVar10 = (0x7fffffffffffffff - lVar12) - (long)psVar18;
    lVar24 = (-0x8000000000000000 - lVar12) - (ulong)(psVar5 != (secp256k1_modinv64_signed62 *)0x0);
    lVar11 = (long)psVar18 - lVar24;
    bVar30 = (SBORROW8(0x7fffffffffffffff - lVar12,(long)psVar18) != SBORROW8(lVar10,uVar7)) ==
             (long)(lVar10 - uVar7) < 0;
    if (lVar12 < 0) {
      bVar30 = (SBORROW8((long)psVar18,lVar24) !=
               SBORROW8(lVar11,(ulong)(uVar21 < (ulong)-(long)psVar5))) ==
               (long)(lVar11 - (ulong)(uVar21 < (ulong)-(long)psVar5)) < 0;
    }
    psVar13 = psVar17;
    if (!bVar30) goto LAB_00118416;
    uVar7 = (long)piVar19 + uVar8 >> 0x3e | lVar16 * 4;
    uVar25 = local_b0 * local_38 + uVar7;
    lVar24 = SUB168(SEXT816((long)local_b0) * SEXT816(local_38),8) + (lVar16 >> 0x3e) +
             (ulong)CARRY8(local_b0 * local_38,uVar7);
    uVar8 = (long)local_a8 * (long)psVar17;
    lVar11 = SUB168(SEXT816((long)local_a8) * SEXT816((long)psVar17),8);
    uVar7 = (ulong)(-uVar8 - 1 < uVar25);
    lVar16 = (0x7fffffffffffffff - lVar11) - lVar24;
    lVar27 = (-0x8000000000000000 - lVar11) - (ulong)(uVar8 != 0);
    lVar10 = lVar24 - lVar27;
    bVar30 = (SBORROW8(0x7fffffffffffffff - lVar11,lVar24) != SBORROW8(lVar16,uVar7)) ==
             (long)(lVar16 - uVar7) < 0;
    if (lVar11 < 0) {
      bVar30 = (SBORROW8(lVar24,lVar27) != SBORROW8(lVar10,(ulong)(uVar25 < -uVar8))) ==
               (long)(lVar10 - (ulong)(uVar25 < -uVar8)) < 0;
    }
    psVar13 = (secp256k1_modinv64_signed62 *)(ulong)bVar30;
    psVar17 = psVar15;
    if (bVar30 == false) goto LAB_0011841b;
    psVar17 = (secp256k1_modinv64_signed62 *)0x7fffffffffffffff;
    uVar9 = (long)psVar5->v + uVar21;
    lVar16 = (long)psVar18->v + (ulong)CARRY8(uVar21,(ulong)psVar5) + lVar12;
    lVar11 = lVar24 + lVar11 + (ulong)CARRY8(uVar25,uVar8);
    uVar7 = lVar16 * 4 | uVar9 >> 0x3e;
    psVar5 = (secp256k1_modinv64_signed62 *)(uVar25 + uVar8 & 0x3fffffffffffffff);
    uVar20 = local_a0 * (long)local_48 + uVar7;
    psVar18 = (secp256k1_modinv64_signed62 *)
              ((lVar16 >> 0x3e) + SUB168(SEXT816((long)local_a0) * SEXT816((long)local_48),8) +
              (ulong)CARRY8(local_a0 * (long)local_48,uVar7));
    uVar21 = (long)local_98 * local_40;
    lVar10 = SUB168(SEXT816((long)local_98) * SEXT816(local_40),8);
    uVar7 = (ulong)(-uVar21 - 1 < uVar20);
    lVar16 = (0x7fffffffffffffff - lVar10) - (long)psVar18;
    psVar13 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - lVar10) - (ulong)(uVar21 != 0))
    ;
    d->v[0] = uVar9 & 0x3fffffffffffffff;
    e->v[0] = (int64_t)psVar5;
    bVar30 = (SBORROW8(0x7fffffffffffffff - lVar10,(long)psVar18) != SBORROW8(lVar16,uVar7)) ==
             (long)(lVar16 - uVar7) < 0;
    if (lVar10 < 0) {
      bVar30 = (SBORROW8((long)psVar18,(long)psVar13) !=
               SBORROW8((long)psVar18 - (long)psVar13,(ulong)(uVar20 < -uVar21))) ==
               (long)(((long)psVar18 - (long)psVar13) - (ulong)(uVar20 < -uVar21)) < 0;
    }
    psVar28 = local_48;
    if (!bVar30) goto LAB_00118420;
    uVar7 = uVar25 + uVar8 >> 0x3e | lVar11 * 4;
    uVar25 = local_b0 * (long)local_48 + uVar7;
    psVar5 = (secp256k1_modinv64_signed62 *)
             (SUB168(SEXT816((long)local_b0) * SEXT816((long)local_48),8) + (lVar11 >> 0x3e) +
             (ulong)CARRY8(local_b0 * (long)local_48,uVar7));
    uVar8 = (long)local_a8 * local_40;
    lVar12 = SUB168(SEXT816((long)local_a8) * SEXT816(local_40),8);
    uVar7 = (ulong)(-uVar8 - 1 < uVar25);
    lVar16 = (0x7fffffffffffffff - lVar12) - (long)psVar5;
    lVar24 = (-0x8000000000000000 - lVar12) - (ulong)(uVar8 != 0);
    lVar11 = (long)psVar5 - lVar24;
    bVar30 = (SBORROW8(0x7fffffffffffffff - lVar12,(long)psVar5) != SBORROW8(lVar16,uVar7)) ==
             (long)(lVar16 - uVar7) < 0;
    if (lVar12 < 0) {
      bVar30 = (SBORROW8((long)psVar5,lVar24) != SBORROW8(lVar11,(ulong)(uVar25 < -uVar8))) ==
               (long)(lVar11 - (ulong)(uVar25 < -uVar8)) < 0;
    }
    if (!bVar30) goto LAB_00118425;
    lVar16 = (long)psVar18->v + (ulong)CARRY8(uVar20,uVar21) + lVar10;
    psVar5 = (secp256k1_modinv64_signed62 *)((long)psVar5->v + (ulong)CARRY8(uVar25,uVar8) + lVar12)
    ;
    uVar7 = lVar16 * 4 | uVar20 + uVar21 >> 0x3e;
    uVar22 = local_a0 * local_50 + uVar7;
    psVar18 = (secp256k1_modinv64_signed62 *)
              ((lVar16 >> 0x3e) + SUB168(SEXT816((long)local_a0) * SEXT816(local_50),8) +
              (ulong)CARRY8(local_a0 * local_50,uVar7));
    uVar9 = (long)local_98 * (long)local_60;
    lVar10 = SUB168(SEXT816((long)local_98) * SEXT816((long)local_60),8);
    uVar7 = (ulong)(-uVar9 - 1 < uVar22);
    lVar16 = (0x7fffffffffffffff - lVar10) - (long)psVar18;
    psVar17 = (secp256k1_modinv64_signed62 *)0x0;
    psVar13 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - lVar10) - (ulong)(uVar9 != 0));
    d->v[1] = uVar20 + uVar21 & 0x3fffffffffffffff;
    e->v[1] = uVar25 + uVar8 & 0x3fffffffffffffff;
    bVar30 = (SBORROW8(0x7fffffffffffffff - lVar10,(long)psVar18) != SBORROW8(lVar16,uVar7)) ==
             (long)(lVar16 - uVar7) < 0;
    if (lVar10 < 0) {
      bVar30 = (SBORROW8((long)psVar18,(long)psVar13) !=
               SBORROW8((long)psVar18 - (long)psVar13,(ulong)(uVar22 < -uVar9))) ==
               (long)(((long)psVar18 - (long)psVar13) - (ulong)(uVar22 < -uVar9)) < 0;
    }
    psVar28 = local_60;
    if (!bVar30) goto LAB_0011842a;
    uVar7 = uVar25 + uVar8 >> 0x3e | (long)psVar5 * 4;
    uVar21 = local_b0 * local_50 + uVar7;
    lVar12 = SUB168(SEXT816((long)local_b0) * SEXT816(local_50),8) + ((long)psVar5 >> 0x3e) +
             (ulong)CARRY8(local_b0 * local_50,uVar7);
    uVar8 = (long)local_a8 * (long)local_60;
    lVar11 = SUB168(SEXT816((long)local_a8) * SEXT816((long)local_60),8);
    psVar28 = (secp256k1_modinv64_signed62 *)0x7fffffffffffffff;
    uVar7 = (ulong)(-uVar8 - 1 < uVar21);
    lVar16 = (0x7fffffffffffffff - lVar11) - lVar12;
    psVar5 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - lVar11) - (ulong)(uVar8 != 0));
    bVar30 = (SBORROW8(lVar12,(long)psVar5) !=
             SBORROW8(lVar12 - (long)psVar5,(ulong)(uVar21 < -uVar8))) ==
             (long)((lVar12 - (long)psVar5) - (ulong)(uVar21 < -uVar8)) < 0;
    psVar13 = (secp256k1_modinv64_signed62 *)(ulong)bVar30;
    bVar2 = (SBORROW8(0x7fffffffffffffff - lVar11,lVar12) != SBORROW8(lVar16,uVar7)) ==
            (long)(lVar16 - uVar7) < 0;
    if (lVar11 < 0) {
      bVar2 = bVar30;
    }
    if (!bVar2) goto LAB_0011842f;
    lVar16 = (long)psVar18->v + (ulong)CARRY8(uVar22,uVar9) + lVar10;
    lVar11 = lVar12 + lVar11 + (ulong)CARRY8(uVar21,uVar8);
    uVar7 = lVar16 * 4 | uVar22 + uVar9 >> 0x3e;
    uVar20 = local_a0 * (long)local_80 + uVar7;
    psVar18 = (secp256k1_modinv64_signed62 *)
              ((lVar16 >> 0x3e) + SUB168(SEXT816((long)local_a0) * SEXT816((long)local_80),8) +
              (ulong)CARRY8(local_a0 * (long)local_80,uVar7));
    uVar25 = (long)local_98 * local_78;
    lVar10 = SUB168(SEXT816((long)local_98) * SEXT816(local_78),8);
    uVar7 = (ulong)(-uVar25 - 1 < uVar20);
    lVar16 = (0x7fffffffffffffff - lVar10) - (long)psVar18;
    bVar30 = (SBORROW8(0x7fffffffffffffff - lVar10,(long)psVar18) != SBORROW8(lVar16,uVar7)) ==
             (long)(lVar16 - uVar7) < 0;
    psVar13 = (secp256k1_modinv64_signed62 *)CONCAT71((int7)(-uVar25 - 1 >> 8),bVar30);
    lVar12 = (-0x8000000000000000 - lVar10) - (ulong)(uVar25 != 0);
    lVar16 = (long)psVar18 - lVar12;
    d->v[2] = uVar22 + uVar9 & 0x3fffffffffffffff;
    e->v[2] = uVar21 + uVar8 & 0x3fffffffffffffff;
    if (lVar10 < 0) {
      bVar30 = (SBORROW8((long)psVar18,lVar12) != SBORROW8(lVar16,(ulong)(uVar20 < -uVar25))) ==
               (long)(lVar16 - (ulong)(uVar20 < -uVar25)) < 0;
    }
    psVar17 = local_80;
    psVar5 = d;
    if (!bVar30) goto LAB_00118434;
    uVar7 = uVar21 + uVar8 >> 0x3e | lVar11 * 4;
    uVar21 = uVar20 + uVar25;
    psVar18 = (secp256k1_modinv64_signed62 *)
              ((long)psVar18->v + (ulong)CARRY8(uVar20,uVar25) + lVar10);
    uVar25 = local_b0 * (long)local_80 + uVar7;
    lVar11 = SUB168(SEXT816((long)local_b0) * SEXT816((long)local_80),8) + (lVar11 >> 0x3e) +
             (ulong)CARRY8(local_b0 * (long)local_80,uVar7);
    uVar8 = (long)local_a8 * local_78;
    lVar10 = SUB168(SEXT816((long)local_a8) * SEXT816(local_78),8);
    uVar7 = (ulong)(-uVar8 - 1 < uVar25);
    lVar16 = (0x7fffffffffffffff - lVar10) - lVar11;
    iVar14 = 0;
    alen = 0;
    psVar5 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - lVar10) - (ulong)(uVar8 != 0));
    bVar30 = (SBORROW8(lVar11,(long)psVar5) !=
             SBORROW8(lVar11 - (long)psVar5,(ulong)(uVar25 < -uVar8))) ==
             (long)((lVar11 - (long)psVar5) - (ulong)(uVar25 < -uVar8)) < 0;
    psVar13 = (secp256k1_modinv64_signed62 *)(ulong)bVar30;
    bVar2 = (SBORROW8(0x7fffffffffffffff - lVar10,lVar11) != SBORROW8(lVar16,uVar7)) ==
            (long)(lVar16 - uVar7) < 0;
    if (lVar10 < 0) {
      bVar2 = bVar30;
    }
    iVar3 = 0;
    if (!bVar2) goto LAB_00118439;
    uVar20 = uVar25 + uVar8;
    lVar10 = lVar11 + lVar10 + (ulong)CARRY8(uVar25,uVar8);
    uVar9 = ((long)local_68 >> 0x3f) << 8 | (ulong)local_68 >> 0x38;
    uVar25 = (long)local_68 * 0x100;
    uVar7 = (ulong)((long)local_68 * -0x100 - 1U < uVar21);
    lVar16 = (0x7fffffffffffffff - uVar9) - (long)psVar18;
    psVar5 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - uVar9) - (ulong)(uVar25 != 0));
    uVar8 = (ulong)(uVar21 < (ulong)((long)local_68 * -0x100));
    bVar30 = (SBORROW8((long)psVar18,(long)psVar5) != SBORROW8((long)psVar18 - (long)psVar5,uVar8))
             == (long)(((long)psVar18 - (long)psVar5) - uVar8) < 0;
    psVar13 = (secp256k1_modinv64_signed62 *)(ulong)bVar30;
    bVar2 = (SBORROW8(0x7fffffffffffffff - uVar9,(long)psVar18) != SBORROW8(lVar16,uVar7)) ==
            (long)(lVar16 - uVar7) < 0;
    if ((long)local_68 < 0) {
      bVar2 = bVar30;
    }
    if (!bVar2) goto LAB_0011843e;
    uVar26 = (long)psVar15 << 8 | (ulong)factor >> 0x38;
    uVar22 = (long)factor * 0x100;
    uVar7 = (ulong)((long)factor * -0x100 - 1U < uVar20);
    lVar16 = (0x7fffffffffffffff - uVar26) - lVar10;
    psVar5 = (secp256k1_modinv64_signed62 *)((-0x8000000000000000 - uVar26) - (ulong)(uVar22 != 0));
    uVar8 = (ulong)(uVar20 < (ulong)((long)factor * -0x100));
    psVar28 = (secp256k1_modinv64_signed62 *)((lVar10 - (long)psVar5) - uVar8);
    bVar30 = (long)factor < 0;
    factor = (secp256k1_modinv64_signed62 *)
             (ulong)((SBORROW8(lVar10,(long)psVar5) != SBORROW8(lVar10 - (long)psVar5,uVar8)) ==
                    (long)psVar28 < 0);
    psVar13 = (secp256k1_modinv64_signed62 *)
              (ulong)((SBORROW8(0x7fffffffffffffff - uVar26,lVar10) != SBORROW8(lVar16,uVar7)) ==
                     (long)(lVar16 - uVar7) < 0);
    if (bVar30) {
      psVar13 = factor;
    }
    iVar14 = 0;
    if ((char)psVar13 == '\0') goto LAB_00118443;
    lVar16 = (long)psVar18->v + CARRY8(uVar21,uVar25) + uVar9;
    lVar10 = lVar10 + uVar26 + (ulong)CARRY8(uVar20,uVar22);
    uVar7 = lVar16 * 4 | uVar21 + uVar25 >> 0x3e;
    d->v[3] = uVar21 + uVar25 & 0x3fffffffffffffff;
    e->v[3] = uVar20 + uVar22 & 0x3fffffffffffffff;
    factor = (secp256k1_modinv64_signed62 *)(uVar7 + 0x8000000000000000);
    psVar18 = (secp256k1_modinv64_signed62 *)
              ((lVar16 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar7));
    if (psVar18 != (secp256k1_modinv64_signed62 *)0xffffffffffffffff) goto LAB_00118448;
    factor = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    uVar8 = uVar20 + uVar22 >> 0x3e | lVar10 * 4;
    d->v[4] = uVar7;
    alen = (int)uVar8;
    if ((lVar10 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar8) != -1) goto LAB_0011844d;
    e->v[4] = uVar8;
    alen = 5;
    factor = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x11835b;
    psVar18 = d;
    iVar3 = secp256k1_modinv64_mul_cmp_62(d,5,&secp256k1_const_modinfo_fe.modulus,-2);
    if (iVar3 < 1) goto LAB_00118452;
    factor = (secp256k1_modinv64_signed62 *)0x1;
    alen = 5;
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x11837c;
    psVar18 = d;
    iVar3 = secp256k1_modinv64_mul_cmp_62(d,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar3) goto LAB_00118457;
    alen = 5;
    factor = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x11839f;
    psVar18 = e;
    iVar3 = secp256k1_modinv64_mul_cmp_62(e,5,&secp256k1_const_modinfo_fe.modulus,-2);
    if (iVar3 < 1) goto LAB_0011845c;
    factor = (secp256k1_modinv64_signed62 *)0x1;
    alen = 5;
    psStack_c0 = (secp256k1_modinv64_signed62 *)0x1183c0;
    iVar3 = secp256k1_modinv64_mul_cmp_62(e,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (iVar3 < 0) {
      return;
    }
  }
  psStack_c0 = (secp256k1_modinv64_signed62 *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_17();
  psVar17 = &sStack_120;
  psStack_d0 = d;
  psStack_c8 = psVar28;
  psStack_c0 = psVar5;
  secp256k1_modinv64_mul_62(&sStack_f8,e,alen,1);
  psVar28 = a;
  secp256k1_modinv64_mul_62(&sStack_120,a,5,(int64_t)factor);
  lVar16 = 0;
  while ((ulong)sStack_f8.v[lVar16] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_120.v[lVar16]) goto LAB_001184f6;
    lVar16 = lVar16 + 1;
    if (lVar16 == 4) {
      uVar4 = 4;
      while( true ) {
        if (sStack_f8.v[uVar4] < sStack_120.v[uVar4]) {
          return;
        }
        if (sStack_120.v[uVar4] < sStack_f8.v[uVar4]) break;
        bVar30 = uVar4 == 0;
        uVar4 = uVar4 - 1;
        if (bVar30) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_001184f6:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  lVar16 = psVar17->v[0];
  uVar7 = psVar17->v[1];
  uVar8 = psVar17->v[2];
  uVar21 = psVar17->v[3];
  lVar10 = psVar17->v[4];
  lVar11 = 0;
  do {
    if (psVar17->v[lVar11] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_00118720:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_00118725;
    }
    if (0x3fffffffffffffff < psVar17->v[lVar11]) goto LAB_00118720;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 5);
  iVar3 = secp256k1_modinv64_mul_cmp_62(psVar17,5,&secp256k1_const_modinfo_fe.modulus,-2);
  if (iVar3 < 1) {
LAB_00118725:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_0011872a:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_0011872f:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar3 = secp256k1_modinv64_mul_cmp_62(psVar17,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar3) goto LAB_0011872a;
    uVar25 = lVar10 >> 0x3f;
    uVar29 = (long)psVar28 >> 0x3f;
    uVar20 = (lVar16 + (uVar25 & 0xfffffffefffffc2f) ^ uVar29) - uVar29;
    uVar9 = ((long)uVar20 >> 0x3e) + ((uVar7 ^ uVar29) - uVar29);
    uVar22 = ((long)uVar9 >> 0x3e) + ((uVar8 ^ uVar29) - uVar29);
    uVar26 = ((long)uVar22 >> 0x3e) + ((uVar21 ^ uVar29) - uVar29);
    lVar16 = ((long)uVar26 >> 0x3e) + (((uVar25 & 0x100) + lVar10 ^ uVar29) - uVar29);
    uVar21 = lVar16 >> 0x3f;
    uVar7 = (uVar21 & 0xfffffffefffffc2f) + (uVar20 & 0x3fffffffffffffff);
    uVar8 = ((long)uVar7 >> 0x3e) + (uVar9 & 0x3fffffffffffffff);
    uVar25 = ((long)uVar8 >> 0x3e) + (uVar22 & 0x3fffffffffffffff);
    uVar20 = ((long)uVar25 >> 0x3e) + (uVar26 & 0x3fffffffffffffff);
    uVar21 = ((long)uVar20 >> 0x3e) + (uVar21 & 0x100) + lVar16;
    psVar17->v[0] = uVar7 & 0x3fffffffffffffff;
    psVar17->v[1] = uVar8 & 0x3fffffffffffffff;
    psVar17->v[2] = uVar25 & 0x3fffffffffffffff;
    psVar17->v[3] = uVar20 & 0x3fffffffffffffff;
    psVar17->v[4] = uVar21;
    if (0x3fffffffffffffff < uVar21) goto LAB_0011872f;
    iVar3 = secp256k1_modinv64_mul_cmp_62(psVar17,5,&secp256k1_const_modinfo_fe.modulus,0);
    if (-1 < iVar3) {
      iVar3 = secp256k1_modinv64_mul_cmp_62(psVar17,5,&secp256k1_const_modinfo_fe.modulus,1);
      if (iVar3 < 0) {
        return;
      }
      goto LAB_00118739;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_00118739:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

static void secp256k1_modinv64_update_de_62(secp256k1_modinv64_signed62 *d, secp256k1_modinv64_signed62 *e, const secp256k1_modinv64_trans2x2 *t, const secp256k1_modinv64_modinfo* modinfo) {
    const uint64_t M62 = UINT64_MAX >> 2;
    const int64_t d0 = d->v[0], d1 = d->v[1], d2 = d->v[2], d3 = d->v[3], d4 = d->v[4];
    const int64_t e0 = e->v[0], e1 = e->v[1], e2 = e->v[2], e3 = e->v[3], e4 = e->v[4];
    const int64_t u = t->u, v = t->v, q = t->q, r = t->r;
    int64_t md, me, sd, se;
    secp256k1_int128 cd, ce;
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, 1) < 0);  /* e <    modulus */
    VERIFY_CHECK(secp256k1_modinv64_abs(u) <= (((int64_t)1 << 62) - secp256k1_modinv64_abs(v))); /* |u|+|v| <= 2^62 */
    VERIFY_CHECK(secp256k1_modinv64_abs(q) <= (((int64_t)1 << 62) - secp256k1_modinv64_abs(r))); /* |q|+|r| <= 2^62 */

    /* [md,me] start as zero; plus [u,q] if d is negative; plus [v,r] if e is negative. */
    sd = d4 >> 63;
    se = e4 >> 63;
    md = (u & sd) + (v & se);
    me = (q & sd) + (r & se);
    /* Begin computing t*[d,e]. */
    secp256k1_i128_mul(&cd, u, d0);
    secp256k1_i128_accum_mul(&cd, v, e0);
    secp256k1_i128_mul(&ce, q, d0);
    secp256k1_i128_accum_mul(&ce, r, e0);
    /* Correct md,me so that t*[d,e]+modulus*[md,me] has 62 zero bottom bits. */
    md -= (modinfo->modulus_inv62 * secp256k1_i128_to_u64(&cd) + md) & M62;
    me -= (modinfo->modulus_inv62 * secp256k1_i128_to_u64(&ce) + me) & M62;
    /* Update the beginning of computation for t*[d,e]+modulus*[md,me] now md,me are known. */
    secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[0], md);
    secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[0], me);
    /* Verify that the low 62 bits of the computation are indeed zero, and then throw them away. */
    VERIFY_CHECK((secp256k1_i128_to_u64(&cd) & M62) == 0); secp256k1_i128_rshift(&cd, 62);
    VERIFY_CHECK((secp256k1_i128_to_u64(&ce) & M62) == 0); secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 1 of t*[d,e]+modulus*[md,me], and store it as output limb 0 (= down shift). */
    secp256k1_i128_accum_mul(&cd, u, d1);
    secp256k1_i128_accum_mul(&cd, v, e1);
    secp256k1_i128_accum_mul(&ce, q, d1);
    secp256k1_i128_accum_mul(&ce, r, e1);
    if (modinfo->modulus.v[1]) { /* Optimize for the case where limb of modulus is zero. */
        secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[1], md);
        secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[1], me);
    }
    d->v[0] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[0] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 2 of t*[d,e]+modulus*[md,me], and store it as output limb 1. */
    secp256k1_i128_accum_mul(&cd, u, d2);
    secp256k1_i128_accum_mul(&cd, v, e2);
    secp256k1_i128_accum_mul(&ce, q, d2);
    secp256k1_i128_accum_mul(&ce, r, e2);
    if (modinfo->modulus.v[2]) { /* Optimize for the case where limb of modulus is zero. */
        secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[2], md);
        secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[2], me);
    }
    d->v[1] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[1] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 3 of t*[d,e]+modulus*[md,me], and store it as output limb 2. */
    secp256k1_i128_accum_mul(&cd, u, d3);
    secp256k1_i128_accum_mul(&cd, v, e3);
    secp256k1_i128_accum_mul(&ce, q, d3);
    secp256k1_i128_accum_mul(&ce, r, e3);
    if (modinfo->modulus.v[3]) { /* Optimize for the case where limb of modulus is zero. */
        secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[3], md);
        secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[3], me);
    }
    d->v[2] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[2] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 4 of t*[d,e]+modulus*[md,me], and store it as output limb 3. */
    secp256k1_i128_accum_mul(&cd, u, d4);
    secp256k1_i128_accum_mul(&cd, v, e4);
    secp256k1_i128_accum_mul(&ce, q, d4);
    secp256k1_i128_accum_mul(&ce, r, e4);
    secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[4], md);
    secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[4], me);
    d->v[3] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[3] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* What remains is limb 5 of t*[d,e]+modulus*[md,me]; store it as output limb 4. */
    d->v[4] = secp256k1_i128_to_i64(&cd);
    e->v[4] = secp256k1_i128_to_i64(&ce);

    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, 1) < 0);  /* e <    modulus */
}